

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void secp256k1_bulletproof_serialize_points(uchar *out,secp256k1_ge *pt,size_t n)

{
  int iVar1;
  ulong uVar2;
  uchar *r;
  secp256k1_fe *a;
  secp256k1_fe pointx;
  
  uVar2 = n + 7 >> 3;
  memset(out,0,uVar2);
  r = out + uVar2;
  a = &pt->y;
  for (uVar2 = 0; n != uVar2; uVar2 = uVar2 + 1) {
    pointx.n[4] = (((secp256k1_ge *)(a + -1))->x).n[4];
    pointx.n[0] = (((secp256k1_ge *)(a + -1))->x).n[0];
    pointx.n[1] = (((secp256k1_ge *)(a + -1))->x).n[1];
    pointx.n[2] = (((secp256k1_ge *)(a + -1))->x).n[2];
    pointx.n[3] = (((secp256k1_ge *)(a + -1))->x).n[3];
    secp256k1_fe_normalize(&pointx);
    secp256k1_fe_get_b32(r,&pointx);
    iVar1 = secp256k1_fe_is_quad_var(a);
    if (iVar1 == 0) {
      out[uVar2 >> 3] = out[uVar2 >> 3] | (byte)(1L << ((byte)uVar2 & 7));
    }
    r = r + 0x20;
    a = (secp256k1_fe *)((long)(a + 2) + 8);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_bulletproof_serialize_points(unsigned char *out, secp256k1_ge *pt, size_t n) {
    const size_t bitveclen = (n + 7) / 8;
    size_t i;

    memset(out, 0, bitveclen);
    for (i = 0; i < n; i++) {
        secp256k1_fe pointx;
        pointx = pt[i].x;
        secp256k1_fe_normalize(&pointx);
        secp256k1_fe_get_b32(&out[bitveclen + i*32], &pointx);
        if (!secp256k1_fe_is_quad_var(&pt[i].y)) {
            out[i/8] |= (1ull << (i % 8));
        }
    }
}